

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O2

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  uint *puVar1;
  int iVar2;
  TValue *pTVar3;
  int *piVar4;
  char *pcVar5;
  
  if (stat == 0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    (pTVar3->field_2).it = 0xffffffff;
    pcVar5 = strerror(iVar2);
    if (fname == (char *)0x0) {
      lua_pushfstring(L,"%s",pcVar5);
    }
    else {
      lua_pushfstring(L,"%s: %s",fname,pcVar5);
    }
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)iVar2;
    puVar1 = (uint *)((ulong)(L->glref).ptr32 + 0x31c);
    *puVar1 = *puVar1 & 0xffffffef;
    iVar2 = 3;
  }
  else {
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    (pTVar3->field_2).it = 0xfffffffd;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

LUALIB_API int luaL_fileresult(lua_State *L, int stat, const char *fname)
{
  if (stat) {
    setboolV(L->top++, 1);
    return 1;
  } else {
    int en = errno;  /* Lua API calls may change this value. */
    setnilV(L->top++);
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, strerror(en));
    else
      lua_pushfstring(L, "%s", strerror(en));
    setintV(L->top++, en);
    lj_trace_abort(G(L));
    return 3;
  }
}